

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O3

void __thiscall DBSCAN::KeyEmbCluster(DBSCAN *this,uint emb_id,int clusterId)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pEVar5;
  ulong uVar6;
  
  pEVar1 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar1[emb_id].is_key == true) {
    puVar3 = *(pointer *)
              &pEVar1[emb_id].arrival_embs.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    puVar4 = *(pointer *)
              ((long)&pEVar1[emb_id].arrival_embs.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8);
    if (puVar4 != puVar3) {
      uVar6 = 0;
      pEVar2 = pEVar1;
      do {
        if (pEVar2[puVar3[uVar6]].visited == false) {
          pEVar5 = pEVar2 + puVar3[uVar6];
          pEVar5->cluster_id = clusterId;
          pEVar5->visited = true;
          if (pEVar5->is_key == true) {
            KeyEmbCluster(this,pEVar5->emb_id,clusterId);
            pEVar2 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3 = *(pointer *)
                      &pEVar1[emb_id].arrival_embs.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
            puVar4 = *(pointer *)
                      ((long)&pEVar1[emb_id].arrival_embs.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)puVar4 - (long)puVar3 >> 2));
    }
  }
  return;
}

Assistant:

void DBSCAN::KeyEmbCluster(unsigned int emb_id, int clusterId)
{
    Embedding& src_emb = this->embs[emb_id];        //获取数据点对象
    if(!src_emb.IsKey())
        return;
    std::vector<unsigned int>& arrval_embs = src_emb.GetArrivalEmbs();        //获取对象领域内点ID列表
    for(unsigned long i=0; i<arrval_embs.size(); i++)
    {
        Embedding& des_emb = this->embs[arrval_embs[i]];    //获取领域内点数据点
        if(!des_emb.IsVisited())                            //若该对象没有被访问过执行
        {
            //cout << "数据点\t"<< desDp.GetDpId()<<"聚类ID为\t" <<clusterId << endl;
            des_emb.SetClusterID(clusterId);        //设置该对象所属簇的ID为clusterId，即将该对象吸入簇中
            des_emb.SetVisited(true);                //设置该对象已被访问
            if(des_emb.IsKey())                    //若该对象是核心对象
            {
                KeyEmbCluster(des_emb.GetEmbID(),clusterId);    //递归地对该领域点数据的领域内的点执行聚类操作，采用深度优先方法
            }
        }
    }
}